

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O1

void BrotliCompressFragmentFastImpl9
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,int *table,
               uint8_t *cmd_depth,uint16_t *cmd_bits,size_t *cmd_code_numbits,uint8_t *cmd_code,
               size_t *storage_ix,uint8_t *storage)

{
  dword *pdVar1;
  size_t __n;
  size_t *end;
  Elf64_Ehdr *pEVar2;
  byte bVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint32_t *puVar11;
  ulong uVar12;
  bool bVar13;
  byte bVar14;
  ulong uVar15;
  Elf64_Ehdr *array;
  long lVar16;
  ulong uVar17;
  uint8_t *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t *psVar22;
  size_t *psVar23;
  int iVar24;
  int iVar25;
  char *pcVar26;
  ulong uVar27;
  size_t *psVar28;
  size_t *__s2;
  Elf64_Ehdr *len;
  ulong uVar30;
  uint32_t cmd_histo [128];
  uint8_t lit_depth [256];
  uint16_t lit_bits [256];
  size_t *local_5c8;
  Elf64_Ehdr *local_5b8;
  size_t *local_598;
  size_t *local_588;
  Elf64_Ehdr *local_580;
  ulong local_570;
  uint32_t local_538 [21];
  uint32_t local_4e4;
  int local_4e0;
  int local_4dc;
  uint32_t local_47c [17];
  int local_438;
  int aiStack_3f8 [48];
  byte local_338 [256];
  uint16_t local_238 [260];
  dword *pdVar29;
  
  len = (Elf64_Ehdr *)0x18000;
  if (input_size < 0x18000) {
    len = (Elf64_Ehdr *)input_size;
  }
  uVar21 = *storage_ix;
  if (input_size == 0) {
    if (is_last != 0) {
      *(ulong *)(storage + (uVar21 >> 3)) = (ulong)storage[uVar21 >> 3] | 1L << ((byte)uVar21 & 7);
      uVar30 = uVar21 + 1;
      *storage_ix = uVar30;
      *(ulong *)(storage + (uVar30 >> 3)) = (ulong)storage[uVar30 >> 3] | 1L << ((byte)uVar30 & 7);
      *storage_ix = (ulong)((int)uVar21 + 9U & 0xfffffff8);
      return;
    }
    __assert_fail("is_last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                  ,0x1d3,
                  "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                 );
  }
  BrotliStoreMetaBlockHeader((size_t)len,0,storage_ix,storage);
  uVar30 = *storage_ix;
  uVar15 = uVar30 >> 3;
  *(ulong *)(storage + uVar15) = (ulong)storage[uVar15];
  *storage_ix = uVar30 + 0xd;
  local_570 = BuildAndStoreLiteralPrefixCode
                        (m,input,(size_t)len,local_338,local_238,storage_ix,storage);
  uVar30 = *cmd_code_numbits;
  if (7 < uVar30) {
    uVar15 = 0;
    do {
      uVar30 = *storage_ix;
      *(ulong *)(storage + (uVar30 >> 3)) =
           (ulong)cmd_code[uVar15 >> 3] << ((byte)uVar30 & 7) | (ulong)storage[uVar30 >> 3];
      *storage_ix = uVar30 + 8;
      uVar30 = *cmd_code_numbits;
      uVar9 = uVar15 + 0xf;
      uVar15 = uVar15 + 8;
    } while (uVar9 < uVar30);
  }
  uVar5 = (uint)uVar30 & 7;
  if (cmd_code[uVar30 >> 3] >> (sbyte)uVar5 != 0) {
LAB_0011cd46:
    __assert_fail("(bits >> n_bits) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                  ,0x36,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
  uVar15 = *storage_ix;
  *(ulong *)(storage + (uVar15 >> 3)) =
       (ulong)cmd_code[uVar30 >> 3] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
  *storage_ix = uVar5 + uVar15;
  psVar23 = (size_t *)input;
  __s2 = cmd_code_numbits;
  local_5b8 = (Elf64_Ehdr *)input_size;
  local_588 = (size_t *)input;
LAB_0011afdc:
  local_598 = local_588;
  local_5c8 = psVar23;
  local_580 = len;
LAB_0011aff7:
  memcpy(local_538,kCmdHistoSeed,0x200);
  end = (size_t *)((long)local_598 + (long)len);
  if ((Elf64_Ehdr *)0xf < len) {
    pdVar1 = (dword *)((long)&len[-1].e_shentsize + 1);
    pdVar29 = &local_5b8[-1].e_flags;
    if (pdVar1 < &local_5b8[-1].e_flags) {
      pdVar29 = pdVar1;
    }
    psVar28 = (size_t *)((long)pdVar29 + (long)local_598);
    psVar23 = (size_t *)((long)local_598 + 1);
    uVar30 = (ulong)(*(long *)((long)local_598 + 1) * 0x1e35a7bd000000) >> 0x37;
    iVar7 = -1;
LAB_0011b071:
    if (psVar23 <= local_5c8) {
      __assert_fail("next_emit < ip",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                    ,0x216,
                    "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                   );
    }
    uVar5 = 0x20;
    psVar22 = psVar23;
    do {
      sVar4 = *psVar22;
      psVar23 = psVar22;
      while( true ) {
        if ((uint)uVar30 != (uint)(sVar4 * 0x1e35a7bd000000 >> 0x37)) {
          __assert_fail("hash == Hash(next_ip, shift)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                        ,0x21b,
                        "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                       );
        }
        psVar22 = (size_t *)((ulong)(uVar5 >> 5) + (long)psVar23);
        iVar24 = (int)input;
        if (psVar28 < psVar22) {
          iVar6 = 0xb;
        }
        else {
          sVar4 = *psVar22;
          if ((((int)*psVar23 == *(int *)((long)psVar23 + -(long)iVar7)) &&
              (__s2 = (size_t *)((long)psVar23 + -(long)iVar7),
              *(char *)((long)psVar23 + 4) == *(char *)((long)__s2 + 4))) && (0 < iVar7)) {
            table[uVar30] = (int)psVar23 - iVar24;
            iVar6 = 9;
          }
          else {
            if ((long)table[uVar30] < 0) {
              __assert_fail("candidate >= base_ip",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                            ,0x22a,
                            "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                           );
            }
            __s2 = (size_t *)(input + table[uVar30]);
            if (psVar23 <= __s2) {
              __assert_fail("candidate < ip",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                            ,0x22b,
                            "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                           );
            }
            table[uVar30] = (int)psVar23 - iVar24;
            iVar6 = 0;
          }
          uVar30 = sVar4 * 0x1e35a7bd000000 >> 0x37;
        }
        if (iVar6 != 0) break;
        if (((int)*psVar23 == (int)*__s2) &&
           (*(char *)((long)psVar23 + 4) == *(char *)((long)__s2 + 4))) goto LAB_0011b14b;
        sVar4 = *psVar22;
        uVar5 = uVar5 + 1;
        psVar23 = psVar22;
      }
      if (iVar6 != 9) goto LAB_0011b1d0;
LAB_0011b14b:
      uVar5 = uVar5 + 1;
    } while (0x3fff0 < (long)psVar23 - (long)__s2);
    puVar10 = (uint8_t *)((long)end + (-5 - (long)psVar23));
    if ((uint8_t *)0x7 < puVar10) {
      uVar15 = (ulong)puVar10 & 0xfffffffffffffff8;
      pcVar26 = (char *)((long)psVar23 + uVar15 + 5);
      lVar16 = 0;
      uVar9 = 0;
LAB_0011b1a6:
      uVar12 = *(ulong *)((char *)((long)psVar23 + 5) + uVar9 * 8);
      uVar20 = *(ulong *)((long)__s2 + uVar9 * 8 + 5);
      if (uVar12 == uVar20) goto code_r0x0011b1b4;
      uVar20 = uVar20 ^ uVar12;
      uVar15 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
        }
      }
      uVar9 = (uVar15 >> 3 & 0x1fffffff) - lVar16;
      goto LAB_0011b1ea;
    }
    uVar15 = 0;
    pcVar26 = (char *)((long)psVar23 + 5);
LAB_0011c265:
    uVar12 = (ulong)puVar10 & 7;
    uVar9 = uVar15;
    if (uVar12 != 0) {
      uVar20 = uVar15 | uVar12;
      do {
        uVar9 = uVar15;
        if (*(char *)((long)__s2 + uVar15 + 5) != *pcVar26) break;
        pcVar26 = pcVar26 + 1;
        uVar15 = uVar15 + 1;
        uVar12 = uVar12 - 1;
        uVar9 = uVar20;
      } while (uVar12 != 0);
    }
LAB_0011b1ea:
    __n = uVar9 + 5;
    iVar6 = bcmp(psVar23,__s2,__n);
    if (iVar6 != 0) {
      __assert_fail("0 == memcmp(base, candidate, matched)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                    ,0x242,
                    "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                   );
    }
    uVar15 = (long)psVar23 - (long)local_5c8;
    psVar22 = (size_t *)((long)psVar23 + uVar9 + 5);
    if (uVar15 < 0x1842) {
      if (uVar15 < 6) {
        bVar3 = cmd_depth[uVar15 + 0x28];
        if (cmd_bits[uVar15 + 0x28] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        uVar12 = uVar15 | 0x28;
        uVar20 = *storage_ix;
        *(ulong *)(storage + (uVar20 >> 3)) =
             (ulong)cmd_bits[uVar15 + 0x28] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
        *storage_ix = bVar3 + uVar20;
LAB_0011b2a6:
        local_538[uVar12] = local_538[uVar12] + 1;
      }
      else if (uVar15 < 0x82) {
        uVar12 = uVar15 - 2;
        uVar5 = 0x1f;
        if ((uint)uVar12 != 0) {
          for (; (uint)uVar12 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar8 = (uVar5 ^ 0xffffffe0) + 0x1f;
        bVar14 = (byte)uVar8;
        uVar27 = uVar12 >> (bVar14 & 0x3f);
        uVar20 = (ulong)((uVar5 ^ 0xffffffe0) * 2 + 0x3e);
        lVar16 = uVar20 + uVar27;
        bVar3 = cmd_depth[lVar16 + 0x2a];
        if (cmd_bits[lVar16 + 0x2a] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        uVar19 = *storage_ix;
        uVar17 = bVar3 + uVar19;
        *(ulong *)(storage + (uVar19 >> 3)) =
             (ulong)cmd_bits[lVar16 + 0x2a] << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
        *storage_ix = uVar17;
        uVar12 = uVar12 - (uVar27 << (bVar14 & 0x3f));
        if (uVar12 >> (bVar14 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < uVar8) goto LAB_0011cd84;
        *(ulong *)(storage + (uVar17 >> 3)) =
             uVar12 << ((byte)uVar17 & 7) | (ulong)storage[uVar17 >> 3];
        *storage_ix = uVar8 + uVar17;
        local_538[uVar27 + uVar20 + 0x2a] = local_538[uVar27 + uVar20 + 0x2a] + 1;
      }
      else {
        if (uVar15 < 0x842) {
          uVar5 = 0x1f;
          uVar8 = (uint)(uVar15 - 0x42);
          if (uVar8 != 0) {
            for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar12 = 0x51 - (ulong)(uVar5 ^ 0x1f);
          bVar3 = cmd_depth[uVar12];
          if (cmd_bits[uVar12] >> (bVar3 & 0x3f) == 0) {
            if (bVar3 < 0x39) {
              uVar20 = *storage_ix;
              uVar27 = bVar3 + uVar20;
              *(ulong *)(storage + (uVar20 >> 3)) =
                   (ulong)cmd_bits[uVar12] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
              *storage_ix = uVar27;
              uVar20 = (-1L << ((byte)uVar5 & 0x3f)) + (uVar15 - 0x42);
              if (uVar20 >> ((byte)uVar5 & 0x3f) == 0) {
                *(ulong *)(storage + (uVar27 >> 3)) =
                     uVar20 << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
                *storage_ix = uVar5 + uVar27;
                goto LAB_0011b2a6;
              }
              goto LAB_0011cd46;
            }
            goto LAB_0011cd84;
          }
          goto LAB_0011cd46;
        }
        bVar3 = cmd_depth[0x3d];
        if (cmd_bits[0x3d] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        uVar12 = *storage_ix;
        uVar20 = bVar3 + uVar12;
        *(ulong *)(storage + (uVar12 >> 3)) =
             (ulong)cmd_bits[0x3d] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        *storage_ix = uVar20;
        if (0xfff < uVar15 - 0x842) goto LAB_0011cd46;
        *(ulong *)(storage + (uVar20 >> 3)) =
             uVar15 - 0x842 << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
        *storage_ix = uVar20 + 0xc;
        local_4e4 = local_4e4 + 1;
      }
    }
    else {
      uVar12 = ((long)local_5c8 - (long)local_588) * 0x32;
      if ((uVar12 < uVar15 || uVar12 - uVar15 == 0) && (0x3d4 < local_570)) {
        EmitUncompressedMetaBlock((uint8_t *)local_588,(uint8_t *)psVar23,uVar21,storage_ix,storage)
        ;
        local_5b8 = (Elf64_Ehdr *)
                    ((long)local_598 + (long)(local_5b8->e_ident_magic_str + (-1 - (long)psVar23)));
        iVar6 = 0xc;
        bVar13 = false;
        local_5c8 = psVar23;
        local_598 = psVar23;
        goto LAB_0011bc97;
      }
      if (0x5841 < uVar15) {
        bVar3 = cmd_depth[0x3f];
        if (cmd_bits[0x3f] >> (bVar3 & 0x3f) == 0) {
          if (bVar3 < 0x39) {
            uVar12 = *storage_ix;
            uVar20 = bVar3 + uVar12;
            *(ulong *)(storage + (uVar12 >> 3)) =
                 (ulong)cmd_bits[0x3f] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
            *storage_ix = uVar20;
            if (uVar15 - 0x5842 < 0x1000000) {
              *(ulong *)(storage + (uVar20 >> 3)) =
                   uVar15 - 0x5842 << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
              *storage_ix = uVar20 + 0x18;
              local_4dc = local_4dc + 1;
              goto LAB_0011b53e;
            }
            goto LAB_0011cd46;
          }
          goto LAB_0011cd84;
        }
        goto LAB_0011cd46;
      }
      bVar3 = cmd_depth[0x3e];
      if (cmd_bits[0x3e] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < bVar3) goto LAB_0011cd84;
      uVar12 = *storage_ix;
      uVar20 = bVar3 + uVar12;
      *(ulong *)(storage + (uVar12 >> 3)) =
           (ulong)cmd_bits[0x3e] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
      *storage_ix = uVar20;
      if (0x3fff < uVar15 - 0x1842) goto LAB_0011cd46;
      *(ulong *)(storage + (uVar20 >> 3)) =
           uVar15 - 0x1842 << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar20 + 0xe;
      local_4e0 = local_4e0 + 1;
    }
LAB_0011b53e:
    if (psVar23 != local_5c8) {
      uVar12 = *storage_ix;
      lVar16 = 0;
      do {
        bVar3 = local_338[*(byte *)((long)local_5c8 + lVar16)];
        if (local_238[*(byte *)((long)local_5c8 + lVar16)] >> (bVar3 & 0x3f) != 0)
        goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        *(ulong *)(storage + (uVar12 >> 3)) =
             (ulong)local_238[*(byte *)((long)local_5c8 + lVar16)] << ((byte)uVar12 & 7) |
             (ulong)storage[uVar12 >> 3];
        uVar12 = uVar12 + bVar3;
        *storage_ix = uVar12;
        lVar16 = lVar16 + 1;
      } while (uVar15 + (uVar15 == 0) != lVar16);
    }
    iVar6 = (int)((long)psVar23 - (long)__s2);
    if (iVar7 == iVar6) {
      bVar3 = cmd_depth[0x40];
      if (cmd_bits[0x40] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < bVar3) goto LAB_0011cd84;
      uVar15 = *storage_ix;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_bits[0x40] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = bVar3 + uVar15;
      local_438 = local_438 + 1;
    }
    else {
      uVar15 = (long)iVar6 + 3;
      uVar5 = 0x1f;
      if ((uint)uVar15 != 0) {
        for (; (uint)uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar8 = 0x1e - (uVar5 ^ 0x1f);
      uVar12 = (ulong)((uVar15 >> ((ulong)uVar8 & 0x3f) & 1) != 0);
      uVar20 = ((uVar5 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar12;
      bVar3 = cmd_depth[uVar20 + 0x50];
      if (cmd_bits[uVar20 + 0x50] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < bVar3) goto LAB_0011cd84;
      uVar27 = *storage_ix;
      uVar19 = bVar3 + uVar27;
      *(ulong *)(storage + (uVar27 >> 3)) =
           (ulong)cmd_bits[uVar20 + 0x50] << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
      *storage_ix = uVar19;
      uVar15 = uVar15 - (uVar12 + 2 << ((byte)uVar8 & 0x3f));
      if (uVar15 >> ((byte)uVar8 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < uVar8) goto LAB_0011cd84;
      *(ulong *)(storage + (uVar19 >> 3)) =
           uVar15 << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar8 + uVar19;
      aiStack_3f8[uVar20] = aiStack_3f8[uVar20] + 1;
      iVar7 = iVar6;
    }
    if (__n < 0xc) {
      bVar3 = cmd_depth[uVar9 + 1];
      if (cmd_bits[uVar9 + 1] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < bVar3) goto LAB_0011cd84;
      uVar15 = *storage_ix;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_bits[uVar9 + 1] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = bVar3 + uVar15;
      local_538[uVar9 + 1] = local_538[uVar9 + 1] + 1;
    }
    else if (__n < 0x48) {
      uVar15 = uVar9 - 3;
      uVar5 = 0x1f;
      if ((uint)uVar15 != 0) {
        for (; (uint)uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar8 = (uVar5 ^ 0xffffffe0) + 0x1f;
      bVar14 = (byte)uVar8;
      uVar12 = uVar15 >> (bVar14 & 0x3f);
      uVar20 = (ulong)((uVar5 ^ 0xffffffe0) * 2 + 0x3e);
      lVar16 = uVar20 + uVar12;
      bVar3 = cmd_depth[lVar16 + 4];
      if (cmd_bits[lVar16 + 4] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < bVar3) goto LAB_0011cd84;
      uVar27 = *storage_ix;
      uVar19 = bVar3 + uVar27;
      *(ulong *)(storage + (uVar27 >> 3)) =
           (ulong)cmd_bits[lVar16 + 4] << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
      *storage_ix = uVar19;
      uVar15 = uVar15 - (uVar12 << (bVar14 & 0x3f));
      if (uVar15 >> (bVar14 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < uVar8) goto LAB_0011cd84;
      *(ulong *)(storage + (uVar19 >> 3)) =
           uVar15 << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar8 + uVar19;
      local_538[uVar12 + uVar20 + 4] = local_538[uVar12 + uVar20 + 4] + 1;
    }
    else {
      if (__n < 0x88) {
        uVar15 = uVar9 - 3 >> 5;
        bVar3 = cmd_depth[uVar15 + 0x1e];
        if (cmd_bits[uVar15 + 0x1e] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        uVar20 = *storage_ix;
        uVar12 = uVar20 + bVar3;
        uVar27 = uVar20 + bVar3 + 5;
        *(ulong *)(storage + (uVar20 >> 3)) =
             (ulong)cmd_bits[uVar15 + 0x1e] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
        *storage_ix = uVar12;
        *(ulong *)(storage + (uVar12 >> 3)) =
             (ulong)((uint)(uVar9 - 3) & 0x1f) << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        *storage_ix = uVar27;
        bVar3 = cmd_depth[0x40];
        if (cmd_bits[0x40] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        *(ulong *)(storage + (uVar27 >> 3)) =
             (ulong)cmd_bits[0x40] << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
        *storage_ix = bVar3 + uVar27;
        local_47c[uVar15 - 0x11] = local_47c[uVar15 - 0x11] + 1;
      }
      else if (__n < 0x848) {
        uVar5 = 0x1f;
        uVar8 = (uint)(uVar9 - 0x43);
        if (uVar8 != 0) {
          for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        lVar16 = 0x3b - (ulong)(uVar5 ^ 0x1f);
        bVar3 = cmd_depth[lVar16];
        if (cmd_bits[lVar16] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        uVar15 = *storage_ix;
        uVar12 = bVar3 + uVar15;
        *(ulong *)(storage + (uVar15 >> 3)) =
             (ulong)cmd_bits[lVar16] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = uVar12;
        uVar15 = (-1L << ((byte)uVar5 & 0x3f)) + (uVar9 - 0x43);
        if (uVar15 >> ((byte)uVar5 & 0x3f) != 0) goto LAB_0011cd46;
        *(ulong *)(storage + (uVar12 >> 3)) =
             uVar15 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        uVar12 = uVar5 + uVar12;
        *storage_ix = uVar12;
        bVar3 = cmd_depth[0x40];
        if (cmd_bits[0x40] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        *(ulong *)(storage + (uVar12 >> 3)) =
             (ulong)cmd_bits[0x40] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        *storage_ix = bVar3 + uVar12;
        local_538[lVar16] = local_538[lVar16] + 1;
      }
      else {
        bVar3 = cmd_depth[0x27];
        if (cmd_bits[0x27] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        uVar15 = *storage_ix;
        uVar12 = bVar3 + uVar15;
        *(ulong *)(storage + (uVar15 >> 3)) =
             (ulong)cmd_bits[0x27] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = uVar12;
        if (0xffffff < uVar9 - 0x843) goto LAB_0011cd46;
        *(ulong *)(storage + (uVar12 >> 3)) =
             uVar9 - 0x843 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        uVar15 = uVar12 + 0x18;
        *storage_ix = uVar15;
        bVar3 = cmd_depth[0x40];
        if (cmd_bits[0x40] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        *(ulong *)(storage + (uVar15 >> 3)) =
             (ulong)cmd_bits[0x40] << ((byte)uVar12 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = bVar3 + uVar15;
        local_47c[0] = local_47c[0] + 1;
      }
      local_438 = local_438 + 1;
    }
    iVar6 = 0;
    if (psVar28 <= psVar22) {
      iVar6 = 0xb;
    }
    else {
      uVar15 = *(ulong *)((long)psVar23 + uVar9 + 2);
      uVar9 = (uVar15 >> 0x18) * 0x1e35a7bd000000 >> 0x37;
      iVar25 = (int)psVar22 - iVar24;
      table[uVar15 * 0x1e35a7bd000000 >> 0x37] = iVar25 + -3;
      table[(uVar15 >> 8) * 0x1e35a7bd000000 >> 0x37] = iVar25 + -2;
      table[(uVar15 >> 0x10) * 0x1e35a7bd000000 >> 0x37] = iVar25 + -1;
      __s2 = (size_t *)(input + table[uVar9]);
      table[uVar9] = iVar25;
    }
    bVar13 = psVar28 > psVar22;
    local_5c8 = psVar22;
LAB_0011bc97:
    psVar23 = psVar22;
    if (bVar13) {
      do {
        if (((int)*psVar22 != (int)*__s2) ||
           (*(uint8_t *)((long)psVar22 + 4) != *(uint8_t *)((long)__s2 + 4))) goto LAB_0011c24d;
        puVar10 = (uint8_t *)((long)end + (-5 - (long)psVar22));
        if ((uint8_t *)0x7 < puVar10) {
          uVar15 = (ulong)puVar10 & 0xfffffffffffffff8;
          puVar18 = (uint8_t *)((long)psVar22 + uVar15 + 5);
          lVar16 = 0;
          uVar9 = 0;
LAB_0011bcf9:
          uVar12 = *(ulong *)((uint8_t *)((long)psVar22 + 5) + uVar9 * 8);
          uVar20 = *(ulong *)((long)__s2 + uVar9 * 8 + 5);
          if (uVar12 == uVar20) goto code_r0x0011bd07;
          uVar20 = uVar20 ^ uVar12;
          uVar15 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          uVar9 = (uVar15 >> 3 & 0x1fffffff) - lVar16;
          goto LAB_0011bd59;
        }
        uVar15 = 0;
        puVar18 = (uint8_t *)((long)psVar22 + 5);
LAB_0011c1ed:
        uVar12 = (ulong)puVar10 & 7;
        uVar9 = uVar15;
        if (uVar12 != 0) {
          uVar20 = uVar15 | uVar12;
          do {
            uVar9 = uVar15;
            if (*(uint8_t *)((long)__s2 + uVar15 + 5) != *puVar18) break;
            puVar18 = puVar18 + 1;
            uVar15 = uVar15 + 1;
            uVar12 = uVar12 - 1;
            uVar9 = uVar20;
          } while (uVar12 != 0);
        }
LAB_0011bd59:
        iVar6 = 0xe;
        if ((long)psVar22 - (long)__s2 < 0x3fff1) {
          uVar15 = uVar9 + 5;
          iVar7 = bcmp(psVar22,__s2,uVar15);
          if (iVar7 != 0) {
            __assert_fail("0 == memcmp(base, candidate, matched)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                          ,0x27e,
                          "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                         );
          }
          if (uVar15 < 10) {
            bVar3 = cmd_depth[uVar9 + 0x13];
            if (cmd_bits[uVar9 + 0x13] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
            if (0x38 < bVar3) goto LAB_0011cd84;
            uVar12 = *storage_ix;
            *(ulong *)(storage + (uVar12 >> 3)) =
                 (ulong)cmd_bits[uVar9 + 0x13] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
            *storage_ix = bVar3 + uVar12;
            puVar11 = local_538 + uVar9 + 0x13;
          }
          else {
            if (uVar15 < 0x86) {
              uVar9 = uVar9 - 1;
              uVar5 = 0x1f;
              if ((uint)uVar9 != 0) {
                for (; (uint)uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              uVar8 = (uVar5 ^ 0xffffffe0) + 0x1f;
              bVar14 = (byte)uVar8;
              uVar12 = uVar9 >> (bVar14 & 0x3f);
              uVar20 = (ulong)((uVar5 ^ 0xffffffe0) * 2 + 0x3e);
              lVar16 = uVar20 + uVar12;
              bVar3 = cmd_depth[lVar16 + 0x14];
              if (cmd_bits[lVar16 + 0x14] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
              if (0x38 < bVar3) goto LAB_0011cd84;
              uVar27 = *storage_ix;
              uVar19 = bVar3 + uVar27;
              *(ulong *)(storage + (uVar27 >> 3)) =
                   (ulong)cmd_bits[lVar16 + 0x14] << ((byte)uVar27 & 7) |
                   (ulong)storage[uVar27 >> 3];
              *storage_ix = uVar19;
              uVar9 = uVar9 - (uVar12 << (bVar14 & 0x3f));
              if (uVar9 >> (bVar14 & 0x3f) != 0) goto LAB_0011cd46;
              if (0x38 < uVar8) goto LAB_0011cd84;
              lVar16 = uVar12 + uVar20 + 0x14;
              *(ulong *)(storage + (uVar19 >> 3)) =
                   uVar9 << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
              *storage_ix = uVar8 + uVar19;
            }
            else {
              if (0x845 < uVar15) {
                bVar3 = cmd_depth[0x27];
                if (cmd_bits[0x27] >> (bVar3 & 0x3f) == 0) {
                  if (bVar3 < 0x39) {
                    uVar12 = *storage_ix;
                    uVar20 = bVar3 + uVar12;
                    *(ulong *)(storage + (uVar12 >> 3)) =
                         (ulong)cmd_bits[0x27] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
                    *storage_ix = uVar20;
                    if (uVar9 - 0x841 < 0x1000000) {
                      *(ulong *)(storage + (uVar20 >> 3)) =
                           uVar9 - 0x841 << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
                      *storage_ix = uVar20 + 0x18;
                      puVar11 = local_47c;
                      goto LAB_0011c068;
                    }
                    goto LAB_0011cd46;
                  }
                  goto LAB_0011cd84;
                }
                goto LAB_0011cd46;
              }
              uVar5 = 0x1f;
              uVar8 = (uint)(uVar9 - 0x41);
              if (uVar8 != 0) {
                for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              lVar16 = 0x3b - (ulong)(uVar5 ^ 0x1f);
              bVar3 = cmd_depth[lVar16];
              if (cmd_bits[lVar16] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
              if (0x38 < bVar3) goto LAB_0011cd84;
              uVar12 = *storage_ix;
              uVar20 = bVar3 + uVar12;
              *(ulong *)(storage + (uVar12 >> 3)) =
                   (ulong)cmd_bits[lVar16] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
              *storage_ix = uVar20;
              uVar9 = (-1L << ((byte)uVar5 & 0x3f)) + (uVar9 - 0x41);
              if (uVar9 >> ((byte)uVar5 & 0x3f) != 0) goto LAB_0011cd46;
              *(ulong *)(storage + (uVar20 >> 3)) =
                   uVar9 << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
              *storage_ix = uVar5 + uVar20;
            }
            puVar11 = local_538 + lVar16;
          }
LAB_0011c068:
          *puVar11 = *puVar11 + 1;
          iVar7 = (int)((long)psVar22 - (long)__s2);
          uVar9 = (long)iVar7 + 3;
          uVar5 = 0x1f;
          if ((uint)uVar9 != 0) {
            for (; (uint)uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar8 = 0x1e - (uVar5 ^ 0x1f);
          uVar12 = (ulong)((uVar9 >> ((ulong)uVar8 & 0x3f) & 1) != 0);
          uVar20 = ((uVar5 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar12;
          bVar3 = cmd_depth[uVar20 + 0x50];
          if (cmd_bits[uVar20 + 0x50] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
          if (0x38 < bVar3) goto LAB_0011cd84;
          uVar27 = *storage_ix;
          uVar19 = bVar3 + uVar27;
          *(ulong *)(storage + (uVar27 >> 3)) =
               (ulong)cmd_bits[uVar20 + 0x50] << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
          *storage_ix = uVar19;
          uVar9 = uVar9 - (uVar12 + 2 << ((byte)uVar8 & 0x3f));
          if (uVar9 >> ((byte)uVar8 & 0x3f) != 0) goto LAB_0011cd46;
          if (0x38 < uVar8) goto LAB_0011cd84;
          psVar22 = (size_t *)((long)psVar22 + uVar15);
          *(ulong *)(storage + (uVar19 >> 3)) =
               uVar9 << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
          *storage_ix = uVar8 + uVar19;
          aiStack_3f8[uVar20] = aiStack_3f8[uVar20] + 1;
          local_5c8 = psVar22;
          if (psVar22 < psVar28) {
            uVar15 = *(ulong *)((long)psVar22 + -3);
            uVar9 = (uVar15 >> 0x18) * 0x1e35a7bd000000 >> 0x37;
            iVar6 = (int)psVar22 - iVar24;
            table[uVar15 * 0x1e35a7bd000000 >> 0x37] = iVar6 + -3;
            table[(uVar15 >> 8) * 0x1e35a7bd000000 >> 0x37] = iVar6 + -2;
            table[(uVar15 >> 0x10) * 0x1e35a7bd000000 >> 0x37] = iVar6 + -1;
            __s2 = (size_t *)(input + table[uVar9]);
            table[uVar9] = iVar6;
            iVar6 = 0;
          }
          else {
            iVar6 = 0xb;
          }
        }
      } while (iVar6 == 0);
      psVar23 = psVar22;
      if (iVar6 == 0xe) {
LAB_0011c24d:
        psVar23 = (size_t *)((long)psVar22 + 1);
        uVar30 = (ulong)(*(long *)((long)psVar22 + 1) * 0x1e35a7bd000000) >> 0x37;
        iVar6 = 0;
      }
    }
LAB_0011b1d0:
    if (iVar6 != 0) goto LAB_0011c458;
    goto LAB_0011b071;
  }
  goto LAB_0011c483;
code_r0x0011b1b4:
  uVar9 = uVar9 + 1;
  lVar16 = lVar16 + -8;
  if ((ulong)puVar10 >> 3 == uVar9) goto LAB_0011c265;
  goto LAB_0011b1a6;
code_r0x0011bd07:
  uVar9 = uVar9 + 1;
  lVar16 = lVar16 + -8;
  if ((ulong)puVar10 >> 3 == uVar9) goto LAB_0011c1ed;
  goto LAB_0011bcf9;
LAB_0011c458:
  psVar23 = local_5c8;
  if (iVar6 == 0xc) goto LAB_0011c544;
  if (iVar6 != 0xb) {
    return;
  }
LAB_0011c483:
  if (end < local_5c8) {
    __assert_fail("next_emit <= ip_end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                  ,0x29f,
                  "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                 );
  }
  local_598 = (size_t *)((long)local_598 + (long)len);
  local_5b8 = (Elf64_Ehdr *)((long)local_5b8 - (long)len);
  len = (Elf64_Ehdr *)0x10000;
  if (local_5b8 < (Elf64_Ehdr *)0x10000) {
    len = local_5b8;
  }
  if (((local_5b8 == (Elf64_Ehdr *)0x0) ||
      (pEVar2 = (Elf64_Ehdr *)(local_580->e_ident_magic_str + (long)(len->e_ident_magic_str + -2)),
      &Elf64_Ehdr_00100000 < pEVar2)) ||
     (array = local_5b8, iVar7 = ShouldMergeBlock((uint8_t *)local_598,(size_t)len,local_338),
     iVar7 == 0)) goto LAB_0011c60b;
  if (local_580 < (Elf64_Ehdr *)0x10001) {
    __assert_fail("total_block_size > (1 << 16)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                  ,0x2a9,
                  "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                 );
  }
  UpdateBits((ulong)((int)pEVar2 - 1),(int)uVar21 + 3,(size_t)storage,&array->e_ident_magic_num);
  local_580 = pEVar2;
  goto LAB_0011aff7;
LAB_0011c60b:
  psVar23 = end;
  if (end <= local_5c8) goto LAB_0011c544;
  uVar30 = (long)end - (long)local_5c8;
  if (0x1841 < uVar30) {
    uVar15 = ((long)local_5c8 - (long)local_588) * 0x32;
    if ((uVar15 < uVar30 || uVar15 - uVar30 == 0) && (0x3d4 < local_570)) {
      EmitUncompressedMetaBlock((uint8_t *)local_588,(uint8_t *)end,uVar21,storage_ix,storage);
    }
    else {
      if (uVar30 < 0x5842) {
        bVar3 = cmd_depth[0x3e];
        if (cmd_bits[0x3e] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        uVar21 = *storage_ix;
        uVar15 = bVar3 + uVar21;
        *(ulong *)(storage + (uVar21 >> 3)) =
             (ulong)cmd_bits[0x3e] << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
        *storage_ix = uVar15;
        if (0x3fff < uVar30 - 0x1842) goto LAB_0011cd46;
        *(ulong *)(storage + (uVar15 >> 3)) =
             uVar30 - 0x1842 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = uVar15 + 0xe;
        local_4e0 = local_4e0 + 1;
      }
      else {
        bVar3 = cmd_depth[0x3f];
        if (cmd_bits[0x3f] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        uVar21 = *storage_ix;
        uVar15 = bVar3 + uVar21;
        *(ulong *)(storage + (uVar21 >> 3)) =
             (ulong)cmd_bits[0x3f] << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
        *storage_ix = uVar15;
        if (0xffffff < uVar30 - 0x5842) goto LAB_0011cd46;
        *(ulong *)(storage + (uVar15 >> 3)) =
             uVar30 - 0x5842 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = uVar15 + 0x18;
        local_4dc = local_4dc + 1;
      }
      uVar21 = *storage_ix;
      lVar16 = 0;
      do {
        bVar3 = local_338[*(byte *)((long)local_5c8 + lVar16)];
        if (local_238[*(byte *)((long)local_5c8 + lVar16)] >> (bVar3 & 0x3f) != 0)
        goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        *(ulong *)(storage + (uVar21 >> 3)) =
             (ulong)local_238[*(byte *)((long)local_5c8 + lVar16)] << ((byte)uVar21 & 7) |
             (ulong)storage[uVar21 >> 3];
        uVar21 = uVar21 + bVar3;
        *storage_ix = uVar21;
        lVar16 = lVar16 + 1;
      } while (uVar30 + (uVar30 == 0) != lVar16);
    }
    goto LAB_0011c544;
  }
  if (uVar30 < 6) {
    bVar3 = cmd_depth[uVar30 + 0x28];
    if (cmd_bits[uVar30 + 0x28] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
    if (0x38 < bVar3) goto LAB_0011cd84;
    uVar21 = *storage_ix;
    *(ulong *)(storage + (uVar21 >> 3)) =
         (ulong)cmd_bits[uVar30 + 0x28] << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
    *storage_ix = bVar3 + uVar21;
    puVar11 = local_538 + (uVar30 | 0x28);
  }
  else {
    if (uVar30 < 0x82) {
      uVar21 = uVar30 - 2;
      uVar5 = 0x1f;
      if ((uint)uVar21 != 0) {
        for (; (uint)uVar21 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar8 = (uVar5 ^ 0xffffffe0) + 0x1f;
      bVar14 = (byte)uVar8;
      uVar15 = uVar21 >> (bVar14 & 0x3f);
      uVar9 = (ulong)((uVar5 ^ 0xffffffe0) * 2 + 0x3e);
      lVar16 = uVar9 + uVar15;
      bVar3 = cmd_depth[lVar16 + 0x2a];
      if (cmd_bits[lVar16 + 0x2a] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < bVar3) {
LAB_0011cd84:
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      uVar12 = *storage_ix;
      uVar20 = bVar3 + uVar12;
      *(ulong *)(storage + (uVar12 >> 3)) =
           (ulong)cmd_bits[lVar16 + 0x2a] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
      *storage_ix = uVar20;
      uVar21 = uVar21 - (uVar15 << (bVar14 & 0x3f));
      if (uVar21 >> (bVar14 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < uVar8) goto LAB_0011cd84;
      lVar16 = uVar15 + uVar9 + 0x2a;
      *(ulong *)(storage + (uVar20 >> 3)) =
           uVar21 << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar8 + uVar20;
    }
    else {
      if (0x841 < uVar30) {
        bVar3 = cmd_depth[0x3d];
        if (cmd_bits[0x3d] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
        if (0x38 < bVar3) goto LAB_0011cd84;
        uVar21 = *storage_ix;
        uVar15 = bVar3 + uVar21;
        *(ulong *)(storage + (uVar21 >> 3)) =
             (ulong)cmd_bits[0x3d] << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
        *storage_ix = uVar15;
        if (0xfff < uVar30 - 0x842) goto LAB_0011cd46;
        *(ulong *)(storage + (uVar15 >> 3)) =
             uVar30 - 0x842 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = uVar15 + 0xc;
        puVar11 = &local_4e4;
        goto LAB_0011c95a;
      }
      uVar5 = 0x1f;
      uVar8 = (uint)(uVar30 - 0x42);
      if (uVar8 != 0) {
        for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      lVar16 = 0x51 - (ulong)(uVar5 ^ 0x1f);
      bVar3 = cmd_depth[lVar16];
      if (cmd_bits[lVar16] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < bVar3) goto LAB_0011cd84;
      uVar21 = *storage_ix;
      uVar15 = bVar3 + uVar21;
      *(ulong *)(storage + (uVar21 >> 3)) =
           (ulong)cmd_bits[lVar16] << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
      *storage_ix = uVar15;
      uVar21 = (-1L << ((byte)uVar5 & 0x3f)) + (uVar30 - 0x42);
      if (uVar21 >> ((byte)uVar5 & 0x3f) != 0) goto LAB_0011cd46;
      *(ulong *)(storage + (uVar15 >> 3)) =
           uVar21 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar5 + uVar15;
    }
    puVar11 = local_538 + lVar16;
  }
LAB_0011c95a:
  *puVar11 = *puVar11 + 1;
  if (end != local_5c8) {
    uVar21 = *storage_ix;
    lVar16 = 0;
    do {
      bVar3 = local_338[*(byte *)((long)local_5c8 + lVar16)];
      if (local_238[*(byte *)((long)local_5c8 + lVar16)] >> (bVar3 & 0x3f) != 0) goto LAB_0011cd46;
      if (0x38 < bVar3) goto LAB_0011cd84;
      *(ulong *)(storage + (uVar21 >> 3)) =
           (ulong)local_238[*(byte *)((long)local_5c8 + lVar16)] << ((byte)uVar21 & 7) |
           (ulong)storage[uVar21 >> 3];
      uVar21 = uVar21 + bVar3;
      *storage_ix = uVar21;
      lVar16 = lVar16 + 1;
    } while (uVar30 + (uVar30 == 0) != lVar16);
  }
LAB_0011c544:
  if (local_5b8 == (Elf64_Ehdr *)0x0) {
    if (is_last != 0) {
      uVar30 = *storage_ix;
      *(ulong *)(storage + (uVar30 >> 3)) = (ulong)storage[uVar30 >> 3] | 1L << ((byte)uVar30 & 7);
      uVar21 = uVar30 + 1;
      *storage_ix = uVar21;
      *(ulong *)(storage + (uVar21 >> 3)) = (ulong)storage[uVar21 >> 3] | 1L << ((byte)uVar21 & 7);
      *storage_ix = (ulong)((int)uVar30 + 9U & 0xfffffff8);
      return;
    }
    *cmd_code = '\0';
    *cmd_code_numbits = 0;
    BuildAndStoreCommandPrefixCode(local_538,cmd_depth,cmd_bits,cmd_code_numbits,cmd_code);
    return;
  }
  len = (Elf64_Ehdr *)0x18000;
  if (local_5b8 < (Elf64_Ehdr *)0x18000) {
    len = local_5b8;
  }
  uVar21 = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)len,0,storage_ix,storage);
  uVar30 = *storage_ix;
  uVar15 = uVar30 >> 3;
  *(ulong *)(storage + uVar15) = (ulong)storage[uVar15];
  *storage_ix = uVar30 + 0xd;
  local_570 = BuildAndStoreLiteralPrefixCode
                        (m,(uint8_t *)local_598,(size_t)len,local_338,local_238,storage_ix,storage);
  BuildAndStoreCommandPrefixCode(local_538,cmd_depth,cmd_bits,storage_ix,storage);
  local_588 = local_598;
  goto LAB_0011afdc;
}

Assistant:

void BrotliCompressFragmentFast(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size, uint8_t cmd_depth[128],
    uint16_t cmd_bits[128], size_t* cmd_code_numbits, uint8_t* cmd_code,
    size_t* storage_ix, uint8_t* storage) {
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          m, input, input_size, is_last, table, cmd_depth, cmd_bits, \
          cmd_code_numbits, cmd_code, storage_ix, storage);          \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: assert(0); break;
  }
}